

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O0

void __thiscall StringTest::Test9(StringTest *this)

{
  int iVar1;
  allocator<char> local_69;
  uint i;
  string t2;
  allocator<char> local_31;
  string local_30 [8];
  string t1;
  StringTest *this_local;
  
  t1.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"Hello World, I\'d like to look for a string",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"or",&local_69);
  std::allocator<char>::~allocator(&local_69);
  iVar1 = std::__cxx11::string::rfind(local_30,(ulong)&i);
  if (iVar1 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x22d,"Failed to rfind last string( \"or\" )");
  }
  iVar1 = std::__cxx11::string::rfind(local_30,(ulong)&i);
  if (iVar1 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x234,"Failed to refind last string( \"or\" )");
  }
  iVar1 = std::__cxx11::string::rfind(local_30,(ulong)&i);
  if (iVar1 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x23b,"Failed to rfind second string( \"or\" )");
  }
  iVar1 = std::__cxx11::string::rfind((char *)local_30,0x10b704);
  if (iVar1 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x240,"Failed to rfind first \"or\"");
  }
  iVar1 = std::__cxx11::string::rfind((char *)local_30,0x10b704);
  if (iVar1 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x245,"Failed to rerfind first \"or\"");
  }
  iVar1 = std::__cxx11::string::rfind((char *)local_30,0x10b704);
  if (iVar1 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x24a,"Failed to rfind second \"or\"");
  }
  iVar1 = std::__cxx11::string::rfind((char)local_30,0x57);
  if (iVar1 != 6) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x24f,"Failed to rfind \'W\'");
  }
  iVar1 = std::__cxx11::string::rfind((char)local_30,100);
  if (iVar1 != 0xf) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x254,"Failed to rfind first \'o\'");
  }
  iVar1 = std::__cxx11::string::rfind((char)local_30,100);
  if (iVar1 != 10) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x259,"Failed to rfind second \'o\'");
  }
  iVar1 = std::__cxx11::string::rfind((char *)local_30,0x10b80d,0xffffffffffffffff);
  if (iVar1 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x25e,"Failed to rfind first \"or\" (full)");
  }
  iVar1 = std::__cxx11::string::rfind((char *)local_30,0x10b80d,0x1e);
  if (iVar1 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x263,"Failed to rfind second \"or\" (full)");
  }
  iVar1 = std::__cxx11::string::rfind((char *)local_30,0x10b80d,0x1f);
  if (iVar1 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x268,"Failed to rerfind first \"or\" (full)");
  }
  TestCase::TestPassed(&this->super_TestCase);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Test9()
	{
		// rfind
		string t1 = "Hello World, I'd like to look for a string";
		string t2 = "or";
		
		unsigned i = t1.rfind( t2 );
		
		if ( i != 31 )
			TestFailed( "Failed to rfind last string( \"or\" )" );
		
		i = t1.rfind( t2, i );

		LOG_NOTICE( "i = %d", i );
		
		if ( i != 31 )
			TestFailed( "Failed to refind last string( \"or\" )" );

		i = t1.rfind( t2, i - 1 );

		LOG_NOTICE( "i = %d", i );
		
		if ( i != 7 )
			TestFailed( "Failed to rfind second string( \"or\" )" );
		
		i = t1.rfind( "or" );

		if ( i != 31 )
			TestFailed( "Failed to rfind first \"or\"" );

		i = t1.rfind( "or", i );

		if ( i != 31 )
			TestFailed( "Failed to rerfind first \"or\"" );

		i = t1.rfind( "or", i - 1 );

		if ( i != 7 )
			TestFailed( "Failed to rfind second \"or\"" );

		i = t1.rfind( 'W' );

		if ( i != 6 )
			TestFailed( "Failed to rfind \'W\'" );

		i = t1.rfind( 'd', 31 );

		if ( i != 15 )
			TestFailed( "Failed to rfind first \'o\'" );
		
		i = t1.rfind( 'd', 14 );

		if ( i != 10 )
			TestFailed( "Failed to rfind second \'o\'" );
		
		i = t1.rfind( "orlando", string::npos, 2 );

		if ( i != 31 )
			TestFailed( "Failed to rfind first \"or\" (full)" );

		i = t1.rfind( "orlando", 30, 2 );

		if ( i != 7 )
			TestFailed( "Failed to rfind second \"or\" (full)" );

		i = t1.rfind( "orlando", 31, 2 );

		if ( i != 31 )
			TestFailed( "Failed to rerfind first \"or\" (full)" );
		
		TestPassed();
	}